

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int beagleCalculateRootLogLikelihoodsByPartition
              (int instance,int *bufferIndices,int *categoryWeightsIndices,
              int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
              int partitionCount,int count,double *outSumLogLikelihoodByPartition,
              double *outSumLogLikelihood)

{
  BeagleImpl *pBVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  int returnValue;
  BeagleImpl *beagleInstance;
  int in_stack_ffffffffffffff8c;
  undefined4 local_14;
  
  pBVar1 = beagle::getBeagleInstance(in_stack_ffffffffffffff8c);
  if (pBVar1 == (BeagleImpl *)0x0) {
    local_14 = -4;
  }
  else {
    local_14 = (**(code **)(*(long *)pBVar1 + 0x148))
                         (pBVar1,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,
                          in_stack_00000010,in_stack_00000018,in_stack_00000020);
  }
  return local_14;
}

Assistant:

int beagleCalculateRootLogLikelihoodsByPartition(int instance,
                                                 const int* bufferIndices,
                                                 const int* categoryWeightsIndices,
                                                 const int* stateFrequenciesIndices,
                                                 const int* cumulativeScaleIndices,
                                                 const int* partitionIndices,
                                                 int partitionCount,
                                                 int count,
                                                 double* outSumLogLikelihoodByPartition,
                                                 double* outSumLogLikelihood) {
    DEBUG_START_TIME();
//    try {
        beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
        if (beagleInstance == NULL)
            return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
        int returnValue = beagleInstance->calculateRootLogLikelihoodsByPartition(bufferIndices,
                                                                                 categoryWeightsIndices,
                                                                                 stateFrequenciesIndices,
                                                                                 cumulativeScaleIndices,
                                                                                 partitionIndices,
                                                                                 partitionCount,
                                                                                 count,
                                                                                 outSumLogLikelihoodByPartition,
                                                                                 outSumLogLikelihood);
        DEBUG_END_TIME();

#ifdef BEAGLE_DEBUG_FP_REDUCED_PRECISION
        union {double f; long l;} dfp;
        for(int i=0; i < partitionCount; i++) {
            dfp.f = outSumLogLikelihoodByPartition[i];
            dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
            outSumLogLikelihoodByPartition[i] = dfp.f;
        }
        dfp.f = *outSumLogLikelihood;
        dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
        *outSumLogLikelihood = dfp.f;
#endif

        return returnValue;

//    }
//    catch (std::bad_alloc &) {
//        return BEAGLE_ERROR_OUT_OF_MEMORY;
//    }
//    catch (std::out_of_range &) {
//        return BEAGLE_ERROR_OUT_OF_RANGE;
//    }
//    catch (...) {
//        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
//    }


}